

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_get_opcode_ret_type(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  undefined8 uVar1;
  int *in_RCX;
  sexp_conflict in_RSI;
  sexp_conflict in_RDI;
  sexp_conflict res;
  sexp_conflict local_8;
  
  if (in_RCX == (int *)0x0) {
    local_8 = (sexp_conflict)((((in_RDI->value).type.setters)->value).port.stream)->_IO_read_end;
  }
  else if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x1b)) {
    if (*(char *)((long)in_RCX + 0x61) == '\x01') {
      uVar1 = sexp_intern(in_RDI,"error",0xffffffffffffffff);
      local_8 = (sexp_conflict)sexp_cons_op(in_RDI,0,2,uVar1,0x23e);
    }
    else {
      local_8 = sexp_translate_opcode_type(in_RDI,in_RSI);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x1b,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_opcode_ret_type (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  sexp res;
  if (!op)
    return sexp_type_by_index(ctx, SEXP_OBJECT);
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  if (sexp_opcode_code(op) == SEXP_OP_RAISE)
    return sexp_list1(ctx, sexp_intern(ctx, "error", -1));
  res = sexp_opcode_return_type(op);
  if (sexp_fixnump(res))
    res = sexp_type_by_index(ctx, sexp_unbox_fixnum(res));
  return sexp_translate_opcode_type(ctx, res);
}